

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AhoCorasickPlus.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
AhoCorasickPlus::findAll(AhoCorasickPlus *this,string *text,bool keep)

{
  string *in_RSI;
  AC_TRIE_t *in_RDI;
  uint j;
  AC_MATCH_t matchp;
  vector<int,_std::allocator<int>_> *IDs;
  value_type_conflict2 *in_stack_ffffffffffffff78;
  undefined8 local_50;
  undefined4 local_3c;
  
  search((AhoCorasickPlus *)in_RDI,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1134da);
  while (ac_trie_findnext(in_RDI), local_50 != 0) {
    for (local_3c = 0; local_3c < local_50; local_3c = local_3c + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffff78);
    }
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> AhoCorasickPlus::findAll (const std::string& text, bool keep)
{
  this->search(text, keep);

  std::vector<int> IDs;
  AC_MATCH_t matchp;
  unsigned int j;

  while ((matchp = ac_trie_findnext (m_automata)).size)
  {
      for (j = 0; j < matchp.size; j++)
      {
          // Add the id to our vector
          IDs.push_back(matchp.patterns[j].id.u.number);
      }
  }

  return IDs;
}